

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dac_control.c
# Opt level: O3

void daccontrol_setup_chip(void *info,DEV_INFO *devInf,UINT8 ChType,UINT16 Command)

{
  byte bVar1;
  DEV_DEF *devDef;
  char cVar2;
  
  devDef = devInf->devDef;
  *(DEV_DEF **)info = devDef;
  *(DEV_DATA **)((long)info + 8) = devInf->dataPtr;
  *(UINT8 *)((long)info + 0x50) = ChType;
  *(UINT16 *)((long)info + 0x52) = Command;
  *(undefined8 *)((long)info + 0x10) = 0;
  *(undefined8 *)((long)info + 0x18) = 0;
  *(undefined8 *)((long)info + 0x20) = 0;
  *(undefined8 *)((long)info + 0x28) = 0;
  *(undefined8 *)((long)info + 0x30) = 0;
  *(undefined8 *)((long)info + 0x38) = 0;
  *(undefined8 *)((long)info + 0x40) = 0;
  *(undefined8 *)((long)info + 0x48) = 0;
  SndEmu_GetDeviceFunc(devDef,'\0','\x11',0,(void **)((long)info + 0x30));
  SndEmu_GetDeviceFunc(*info,'\0','\x12',0,(void **)((long)info + 0x38));
  SndEmu_GetDeviceFunc(*info,'\0','!',0,(void **)((long)info + 0x40));
  SndEmu_GetDeviceFunc(*info,'\0','\"',0,(void **)((long)info + 0x48));
  SndEmu_GetDeviceFunc(*info,'\x01','\x11',0,(void **)((long)info + 0x10));
  SndEmu_GetDeviceFunc(*info,'\x01','\x12',0,(void **)((long)info + 0x18));
  SndEmu_GetDeviceFunc(*info,'\x01','!',0,(void **)((long)info + 0x20));
  SndEmu_GetDeviceFunc(*info,'\x01','\"',0,(void **)((long)info + 0x28));
  bVar1 = *(byte *)((long)info + 0x50);
  if (bVar1 < 0x11) {
    if ((bVar1 == 0) && ((*(byte *)((long)info + 0x52) & 0x10) == 0)) {
LAB_00123e80:
      *(undefined1 *)((long)info + 0x54) = 2;
      cVar2 = '\x02';
      goto LAB_00123e94;
    }
  }
  else if ((bVar1 == 0x11) || (bVar1 == 0x1f)) goto LAB_00123e80;
  *(undefined1 *)((long)info + 0x54) = 1;
  cVar2 = '\x01';
LAB_00123e94:
  *(char *)((long)info + 0x98) = *(char *)((long)info + 0x74) * cVar2;
  *(undefined1 *)((long)info + 0x7c) = 0;
  return;
}

Assistant:

void daccontrol_setup_chip(void* info, DEV_INFO* devInf, UINT8 ChType, UINT16 Command)
{
	dac_control* chip = (dac_control*)info;
	
	chip->devDef = devInf->devDef;
	chip->chipData = devInf->dataPtr;
	chip->DstChipType = ChType;	// TypeID (e.g. 0x02 for YM2612)
	chip->DstCommand = Command;	// Port and Command (would be 0x02A for YM2612)
	
	memset(&chip->Write, 0x00, sizeof(DEVWRITE_FUNCS));
	memset(&chip->Read, 0x00, sizeof(DEVREAD_FUNCS));
	SndEmu_GetDeviceFunc(chip->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8,   0, (void**)&chip->Write.A8D8);
	SndEmu_GetDeviceFunc(chip->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D16,  0, (void**)&chip->Write.A8D16);
	SndEmu_GetDeviceFunc(chip->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D8,  0, (void**)&chip->Write.A16D8);
	SndEmu_GetDeviceFunc(chip->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D16, 0, (void**)&chip->Write.A16D16);
	SndEmu_GetDeviceFunc(chip->devDef, RWF_REGISTER | RWF_READ, DEVRW_A8D8,   0, (void**)&chip->Read.A8D8);
	SndEmu_GetDeviceFunc(chip->devDef, RWF_REGISTER | RWF_READ, DEVRW_A8D16,  0, (void**)&chip->Read.A8D16);
	SndEmu_GetDeviceFunc(chip->devDef, RWF_REGISTER | RWF_READ, DEVRW_A16D8,  0, (void**)&chip->Read.A16D8);
	SndEmu_GetDeviceFunc(chip->devDef, RWF_REGISTER | RWF_READ, DEVRW_A16D16, 0, (void**)&chip->Read.A16D16);
	
	switch(chip->DstChipType)
	{
	case DEVID_SN76496:
		if (chip->DstCommand & 0x0010)
			chip->CmdSize = 0x01;	// Volume Write
		else
			chip->CmdSize = 0x02;	// Frequency Write
		break;
	case DEVID_YM2612:
		chip->CmdSize = 0x01;
		break;
	case DEVID_32X_PWM:
	case DEVID_QSOUND:
		chip->CmdSize = 0x02;
		break;
	default:
		chip->CmdSize = 0x01;
		break;
	}
	chip->DataStep = chip->CmdSize * chip->StepSize;
	
	chip->Running &= 0x00;
	
	return;
}